

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O2

Trie * load_dictionary(Trie *__return_storage_ptr__,char *fname)

{
  _Alloc_hider str;
  istream *piVar1;
  char *pcVar2;
  double dVar3;
  string line;
  ifstream h;
  
  std::ifstream::ifstream(&h,fname,_S_in);
  Trie::Trie(__return_storage_ptr__);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&h,(string *)&line);
    str = line._M_dataplus;
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    pcVar2 = strchr(line._M_dataplus._M_p,0x20);
    if (pcVar2 == (char *)0x0) {
      Trie::insert(__return_storage_ptr__,str._M_p,1);
    }
    else {
      *pcVar2 = '\0';
      dVar3 = atof(str._M_p);
      Trie::insert(__return_storage_ptr__,pcVar2 + 1,
                   (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
    }
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&h);
  return __return_storage_ptr__;
}

Assistant:

Trie load_dictionary(const char* fname)
{ ifstream h(fname);
  Trie t;
  string line;
  while (getline(h,line))
  { const char* str = line.c_str();
    char* space = (char*)strchr(str, ' ');
    if (space)
    { *space = 0;
      space++;
      t.insert(space, atof(str));
    }
    else
      t.insert(str);
  }
  return t;
}